

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconv_bigint.h
# Opt level: O0

void __thiscall
absl::lts_20240722::strings_internal::BigUnsigned<84>::MultiplyByFiveToTheNth
          (BigUnsigned<84> *this,int n)

{
  int local_14;
  int n_local;
  BigUnsigned<84> *this_local;
  
  for (local_14 = n; 0xc < local_14; local_14 = local_14 + -0xd) {
    MultiplyBy(this,0x48c27395);
  }
  if (0 < local_14) {
    MultiplyBy(this,*(uint32_t *)(kFiveToNth + (long)local_14 * 4));
  }
  return;
}

Assistant:

void MultiplyByFiveToTheNth(int n) {
    while (n >= kMaxSmallPowerOfFive) {
      MultiplyBy(kFiveToNth[kMaxSmallPowerOfFive]);
      n -= kMaxSmallPowerOfFive;
    }
    if (n > 0) {
      MultiplyBy(kFiveToNth[n]);
    }
  }